

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thief.c
# Opt level: O0

void counterfeit_end(OBJ_DATA *obj,OBJ_AFFECT_DATA *af)

{
  AFFECT_DATA *pAVar1;
  DESCRIPTOR_DATA *pDVar2;
  NOTE_DATA *pNVar3;
  char *in_RSI;
  CHAR_DATA *in_RDI;
  char *unaff_retaddr;
  char *in_stack_00000018;
  void *in_stack_ffffffffffffffe8;
  
  if (in_RDI->reply != (CHAR_DATA *)0x0) {
    act(unaff_retaddr,in_RDI,in_RSI,in_stack_ffffffffffffffe8,0);
  }
  if ((in_RDI->hunting != (CHAR_DATA *)0x0) && (in_RDI->hunting->leader != (CHAR_DATA *)0x0)) {
    act(unaff_retaddr,in_RDI,in_RSI,in_stack_ffffffffffffffe8,0);
  }
  free_pstring(in_RSI);
  pAVar1 = (AFFECT_DATA *)palloc_string(in_stack_00000018);
  in_RDI->affected = pAVar1;
  free_pstring(in_RSI);
  pDVar2 = (DESCRIPTOR_DATA *)palloc_string(in_stack_00000018);
  in_RDI->desc = pDVar2;
  free_pstring(in_RSI);
  pNVar3 = (NOTE_DATA *)palloc_string(in_stack_00000018);
  in_RDI->pnote = pNVar3;
  return;
}

Assistant:

void counterfeit_end(OBJ_DATA *obj, OBJ_AFFECT_DATA *af)
{

	if (obj->carried_by)
	{
		act("You suddenly realize that $p is counterfeit, and really $T!",
			obj->carried_by,
			obj,
			obj->pIndexData->short_descr,
			TO_CHAR);
	}

	if (obj->in_room && obj->in_room->people)
	{
		act("You suddenly realize that $p is counterfeit, and really $T!",
			obj->carried_by,
			obj,
			obj->pIndexData->short_descr,
			TO_ALL);
	}

	free_pstring(obj->short_descr);
	obj->short_descr = palloc_string(obj->pIndexData->short_descr);

	free_pstring(obj->name);
	obj->name = palloc_string(obj->pIndexData->name);

	free_pstring(obj->description);
	obj->description = palloc_string(obj->pIndexData->description);
}